

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
::get_ubjson_size_value
          (binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
           *this,size_t *result,bool *is_ndarray,char_int_type prefix)

{
  bool bVar1;
  byte bVar2;
  undefined1 uVar3;
  unsigned_long uVar4;
  size_type sVar5;
  reference pvVar6;
  reference puVar7;
  int in_ECX;
  byte *in_RDX;
  unsigned_long *in_RSI;
  long in_RDI;
  string message;
  string last_token;
  unsigned_long i_1;
  iterator __end6_1;
  iterator __begin6_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range6_1;
  string_t key;
  unsigned_long i;
  iterator __end6;
  iterator __begin6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dim;
  uint64_t number_7;
  uint32_t number_6;
  uint16_t number_5;
  int64_t number_4;
  int32_t number_3;
  int16_t number_2;
  int8_t number_1;
  uint8_t number;
  undefined7 in_stack_fffffffffffff678;
  undefined1 in_stack_fffffffffffff67f;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffff680;
  long *plVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff690;
  undefined8 uVar9;
  undefined4 in_stack_fffffffffffff698;
  undefined4 in_stack_fffffffffffff69c;
  undefined8 in_stack_fffffffffffff6a0;
  undefined5 in_stack_fffffffffffff6a8;
  undefined1 in_stack_fffffffffffff6ad;
  undefined1 in_stack_fffffffffffff6ae;
  undefined1 in_stack_fffffffffffff6af;
  allocator<char> *in_stack_fffffffffffff6b0;
  allocator<char> *__a;
  undefined4 in_stack_fffffffffffff6b8;
  undefined4 in_stack_fffffffffffff6bc;
  undefined4 uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffff6c8;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *this_01;
  string *in_stack_fffffffffffff6d0;
  string *context;
  string *in_stack_fffffffffffff6d8;
  undefined2 uVar11;
  input_format_t in_stack_fffffffffffff6e4;
  input_format_t iVar12;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffff6e8;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *this_02;
  void *in_stack_fffffffffffff728;
  string *in_stack_fffffffffffff730;
  int in_stack_fffffffffffff73c;
  void *in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff798;
  undefined4 in_stack_fffffffffffff79c;
  size_t in_stack_fffffffffffff7a0;
  int in_stack_fffffffffffff7ac;
  allocator<char> local_761;
  string local_760 [32];
  string local_740 [32];
  undefined1 local_720 [40];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [39];
  allocator<char> local_671;
  string local_670 [39];
  undefined1 local_649 [33];
  string local_628 [32];
  undefined1 local_608 [32];
  string local_5e8 [32];
  unsigned_long local_5c8;
  unsigned_long *local_5c0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_5b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_5b0;
  undefined1 local_5a1 [33];
  unsigned_long local_580;
  unsigned_long *local_578;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_570;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_568;
  int local_55c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_558;
  allocator<char> local_539;
  string local_538 [39];
  allocator<char> local_511;
  string local_510 [32];
  string local_4f0 [32];
  undefined1 local_4d0 [40];
  string local_4a8 [39];
  allocator<char> local_481;
  string local_480 [39];
  allocator<char> local_459;
  string local_458 [32];
  string local_438 [32];
  undefined1 local_418 [32];
  string local_3f8 [32];
  unsigned_long local_3d8;
  undefined4 local_3d0;
  undefined2 local_3cc;
  allocator<char> local_3c9;
  string local_3c8 [39];
  allocator<char> local_3a1;
  string local_3a0 [32];
  string local_380 [32];
  undefined1 local_360 [32];
  string local_340 [39];
  allocator<char> local_319;
  string local_318 [39];
  allocator<char> local_2f1;
  string local_2f0 [32];
  string local_2d0 [32];
  undefined1 local_2b0 [40];
  string local_288 [32];
  unsigned_long local_268;
  allocator<char> local_259;
  string local_258 [39];
  allocator<char> local_231;
  string local_230 [32];
  string local_210 [32];
  undefined1 local_1f0 [40];
  string local_1c8 [32];
  int local_1a8;
  allocator<char> local_1a1;
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [32];
  string local_158 [32];
  undefined1 local_138 [40];
  string local_110 [36];
  short local_ec;
  allocator<char> local_e9;
  string local_e8 [55];
  allocator<char> local_b1;
  string local_b0 [32];
  string local_90 [32];
  undefined1 local_70 [40];
  string local_48 [34];
  char local_26;
  byte local_25;
  char_int_type local_24;
  byte *local_20;
  unsigned_long *local_18;
  byte local_1;
  
  iVar12 = (input_format_t)((ulong)in_stack_fffffffffffff6a0 >> 0x20);
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (in_ECX == 0) {
    local_24 = get_ignore_noop(in_stack_fffffffffffff680);
  }
  switch(local_24) {
  case 0x49:
    local_ec = 0;
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<short,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffff6af,
                                   CONCAT16(in_stack_fffffffffffff6ae,
                                            CONCAT15(in_stack_fffffffffffff6ad,
                                                     in_stack_fffffffffffff6a8))),iVar12,
                       (short *)CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_ec < 0) {
        uVar9 = *(undefined8 *)(in_RDI + 0x18);
        plVar8 = *(long **)(in_RDI + 0x28);
        get_token_string(in_stack_fffffffffffff6c8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff6c0,
                   (char *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                   in_stack_fffffffffffff6b0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff6c0,
                   (char *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                   in_stack_fffffffffffff6b0);
        exception_message(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e4,
                          in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
        parse_error::create<std::nullptr_t,_0>
                  (in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a0,
                   (string *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
                   in_stack_fffffffffffff790);
        local_1 = (**(code **)(*plVar8 + 0x60))(plVar8,uVar9,local_110,local_138);
        local_1 = local_1 & 1;
        parse_error::~parse_error((parse_error *)0x27a9ab);
        std::__cxx11::string::~string(local_158);
        std::__cxx11::string::~string(local_1a0);
        std::allocator<char>::~allocator(&local_1a1);
        std::__cxx11::string::~string(local_178);
        std::allocator<char>::~allocator(&local_179);
        std::__cxx11::string::~string(local_110);
      }
      else {
        *local_18 = (long)local_ec;
        local_1 = 1;
      }
    }
    else {
      local_1 = 0;
    }
    goto LAB_0027c37b;
  default:
    break;
  case 0x4c:
    local_268 = 0;
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<long,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffff6af,
                                   CONCAT16(in_stack_fffffffffffff6ae,
                                            CONCAT15(in_stack_fffffffffffff6ad,
                                                     in_stack_fffffffffffff6a8))),iVar12,
                       (long *)CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if ((long)local_268 < 0) {
        uVar9 = *(undefined8 *)(in_RDI + 0x18);
        plVar8 = *(long **)(in_RDI + 0x28);
        get_token_string(in_stack_fffffffffffff6c8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff6c0,
                   (char *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                   in_stack_fffffffffffff6b0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff6c0,
                   (char *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                   in_stack_fffffffffffff6b0);
        exception_message(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e4,
                          in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
        parse_error::create<std::nullptr_t,_0>
                  (in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a0,
                   (string *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
                   in_stack_fffffffffffff790);
        local_1 = (**(code **)(*plVar8 + 0x60))(plVar8,uVar9,local_288,local_2b0);
        local_1 = local_1 & 1;
        parse_error::~parse_error((parse_error *)0x27af74);
        std::__cxx11::string::~string(local_2d0);
        std::__cxx11::string::~string(local_318);
        std::allocator<char>::~allocator(&local_319);
        std::__cxx11::string::~string(local_2f0);
        std::allocator<char>::~allocator(&local_2f1);
        std::__cxx11::string::~string(local_288);
      }
      else {
        bVar1 = value_in_range_of<unsigned_long,long>(0x27b0a3);
        if (bVar1) {
          *local_18 = local_268;
          local_1 = 1;
        }
        else {
          uVar9 = *(undefined8 *)(in_RDI + 0x18);
          plVar8 = *(long **)(in_RDI + 0x28);
          get_token_string(in_stack_fffffffffffff6c8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff6c0,
                     (char *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                     in_stack_fffffffffffff6b0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff6c0,
                     (char *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                     in_stack_fffffffffffff6b0);
          exception_message(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e4,
                            in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
          out_of_range::create<std::nullptr_t,_0>
                    (in_stack_fffffffffffff73c,in_stack_fffffffffffff730,in_stack_fffffffffffff728);
          local_1 = (**(code **)(*plVar8 + 0x60))(plVar8,uVar9,local_340,local_360);
          local_1 = local_1 & 1;
          out_of_range::~out_of_range((out_of_range *)0x27b1ed);
          std::__cxx11::string::~string(local_380);
          std::__cxx11::string::~string(local_3c8);
          std::allocator<char>::~allocator(&local_3c9);
          std::__cxx11::string::~string(local_3a0);
          std::allocator<char>::~allocator(&local_3a1);
          std::__cxx11::string::~string(local_340);
        }
      }
    }
    else {
      local_1 = 0;
    }
    goto LAB_0027c37b;
  case 0x4d:
    if (*(int *)(in_RDI + 0x24) == 5) {
      local_3d8 = 0;
      bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
              ::get_number<unsigned_long,false>
                        ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                          *)CONCAT17(in_stack_fffffffffffff6af,
                                     CONCAT16(in_stack_fffffffffffff6ae,
                                              CONCAT15(in_stack_fffffffffffff6ad,
                                                       in_stack_fffffffffffff6a8))),iVar12,
                         (unsigned_long *)
                         CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        bVar1 = value_in_range_of<unsigned_long,unsigned_long>(0x27b472);
        if (bVar1) {
          uVar4 = conditional_static_cast<unsigned_long,_unsigned_long,_0>(local_3d8);
          *local_18 = uVar4;
          local_1 = 1;
        }
        else {
          uVar9 = *(undefined8 *)(in_RDI + 0x18);
          plVar8 = *(long **)(in_RDI + 0x28);
          get_token_string(in_stack_fffffffffffff6c8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff6c0,
                     (char *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                     in_stack_fffffffffffff6b0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff6c0,
                     (char *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                     in_stack_fffffffffffff6b0);
          exception_message(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e4,
                            in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
          out_of_range::create<std::nullptr_t,_0>
                    (in_stack_fffffffffffff73c,in_stack_fffffffffffff730,in_stack_fffffffffffff728);
          local_1 = (**(code **)(*plVar8 + 0x60))(plVar8,uVar9,local_3f8,local_418);
          local_1 = local_1 & 1;
          out_of_range::~out_of_range((out_of_range *)0x27b5bc);
          std::__cxx11::string::~string(local_438);
          std::__cxx11::string::~string(local_480);
          std::allocator<char>::~allocator(&local_481);
          std::__cxx11::string::~string(local_458);
          std::allocator<char>::~allocator(&local_459);
          std::__cxx11::string::~string(local_3f8);
        }
      }
      else {
        local_1 = 0;
      }
      goto LAB_0027c37b;
    }
    break;
  case 0x55:
    local_25 = 0;
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<unsigned_char,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffff6af,
                                   CONCAT16(in_stack_fffffffffffff6ae,
                                            CONCAT15(in_stack_fffffffffffff6ad,
                                                     in_stack_fffffffffffff6a8))),iVar12,
                       (uchar *)CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      *local_18 = (ulong)local_25;
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
    goto LAB_0027c37b;
  case 0x5b:
    if (*(int *)(in_RDI + 0x24) == 5) {
      if ((*local_20 & 1) == 0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x27b9b8);
        bVar1 = get_ubjson_ndarray_size
                          ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                            *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffff6b0);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_558);
          if ((sVar5 == 1) ||
             ((sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_558),
              sVar5 == 2 &&
              (pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_fffffffffffff680,
                                   CONCAT17(in_stack_fffffffffffff67f,in_stack_fffffffffffff678)),
              *pvVar6 == 1)))) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_558);
            pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                in_stack_fffffffffffff680,
                                CONCAT17(in_stack_fffffffffffff67f,in_stack_fffffffffffff678));
            *local_18 = *pvVar6;
            local_1 = 1;
            local_55c = 1;
          }
          else {
            bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                              (in_stack_fffffffffffff690);
            if (bVar1) {
              *local_18 = 0;
              local_1 = 1;
              local_55c = 1;
            }
            else {
              local_568 = &local_558;
              local_570._M_current =
                   (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              CONCAT17(in_stack_fffffffffffff67f,in_stack_fffffffffffff678));
              local_578 = (unsigned_long *)
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     CONCAT17(in_stack_fffffffffffff67f,in_stack_fffffffffffff678));
              while( true ) {
                bVar1 = __gnu_cxx::operator!=
                                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    *)in_stack_fffffffffffff680,
                                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    *)CONCAT17(in_stack_fffffffffffff67f,in_stack_fffffffffffff678))
                ;
                uVar11 = (undefined2)in_stack_fffffffffffff6e4;
                if (!bVar1) break;
                puVar7 = __gnu_cxx::
                         __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ::operator*(&local_570);
                local_580 = *puVar7;
                if (local_580 == 0) {
                  *local_18 = 0;
                  local_1 = 1;
                  local_55c = 1;
                  goto LAB_0027c0ac;
                }
                __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator++(&local_570);
              }
              this_02 = (binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                         *)local_5a1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff6c0,
                         (char *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                         in_stack_fffffffffffff6b0);
              std::allocator<char>::~allocator((allocator<char> *)local_5a1);
              bVar2 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x38))(*(long **)(in_RDI + 0x28),3);
              iVar12 = CONCAT13(bVar2,CONCAT12(1,uVar11));
              if ((bVar2 & 1) != 0) {
                bVar2 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x40))
                                  (*(long **)(in_RDI + 0x28),local_5a1 + 1);
                iVar12 = CONCAT13((char)(iVar12 >> 0x18),CONCAT12(1,CONCAT11(bVar2,(char)iVar12)));
                if ((bVar2 & 1) != 0) {
                  in_stack_fffffffffffff6d8 = *(string **)(in_RDI + 0x28);
                  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                    (&local_558);
                  uVar3 = (**(code **)(*(long *)in_stack_fffffffffffff6d8 + 0x50))
                                    (in_stack_fffffffffffff6d8,sVar5);
                  iVar12 = CONCAT13((char)(iVar12 >> 0x18),
                                    CONCAT12(uVar3,(short)CONCAT31((int3)(iVar12 >> 8),uVar3))) ^
                           0xff0000;
                }
              }
              if ((iVar12 & 0x10000) == json) {
                *local_18 = 1;
                local_5b0 = &local_558;
                local_5b8._M_current =
                     (unsigned_long *)
                     std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                CONCAT17(in_stack_fffffffffffff67f,in_stack_fffffffffffff678));
                local_5c0 = (unsigned_long *)
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       CONCAT17(in_stack_fffffffffffff67f,in_stack_fffffffffffff678)
                                      );
                while (bVar1 = __gnu_cxx::operator!=
                                         ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                           *)in_stack_fffffffffffff680,
                                          (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                           *)CONCAT17(in_stack_fffffffffffff67f,
                                                      in_stack_fffffffffffff678)), bVar1) {
                  puVar7 = __gnu_cxx::
                           __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           ::operator*(&local_5b8);
                  local_5c8 = *puVar7;
                  *local_18 = local_5c8 * *local_18;
                  if ((*local_18 == 0) || (*local_18 == 0xffffffffffffffff)) {
                    this_01 = *(binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                                **)(in_RDI + 0x18);
                    context = *(string **)(in_RDI + 0x28);
                    get_token_string(this_01);
                    uVar10 = *(undefined4 *)(in_RDI + 0x24);
                    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_649;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (this_00,(char *)CONCAT44(uVar10,in_stack_fffffffffffff6b8),
                               in_stack_fffffffffffff6b0);
                    __a = &local_671;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (this_00,(char *)CONCAT44(uVar10,in_stack_fffffffffffff6b8),__a);
                    exception_message(this_02,iVar12,in_stack_fffffffffffff6d8,context);
                    out_of_range::create<std::nullptr_t,_0>
                              (in_stack_fffffffffffff73c,in_stack_fffffffffffff730,
                               in_stack_fffffffffffff728);
                    local_1 = (**(code **)(*(long *)context + 0x60))
                                        (context,this_01,local_5e8,local_608);
                    local_1 = local_1 & 1;
                    out_of_range::~out_of_range((out_of_range *)0x27bea5);
                    std::__cxx11::string::~string(local_628);
                    std::__cxx11::string::~string(local_670);
                    std::allocator<char>::~allocator(&local_671);
                    std::__cxx11::string::~string((string *)(local_649 + 1));
                    std::allocator<char>::~allocator((allocator<char> *)local_649);
                    std::__cxx11::string::~string(local_5e8);
                    goto LAB_0027c06c;
                  }
                  bVar2 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))
                                    (*(long **)(in_RDI + 0x28),local_5c8);
                  if (((bVar2 ^ 0xff) & 1) != 0) {
                    local_1 = 0;
                    goto LAB_0027c06c;
                  }
                  __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator++(&local_5b8);
                }
                *local_20 = 1;
                local_1 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x58))();
                local_1 = local_1 & 1;
              }
              else {
                local_1 = 0;
              }
LAB_0027c06c:
              local_55c = 1;
              std::__cxx11::string::~string((string *)(local_5a1 + 1));
            }
          }
        }
        else {
          local_1 = 0;
          local_55c = 1;
        }
LAB_0027c0ac:
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  (in_stack_fffffffffffff690);
      }
      else {
        uVar9 = *(undefined8 *)(in_RDI + 0x18);
        plVar8 = *(long **)(in_RDI + 0x28);
        get_token_string(in_stack_fffffffffffff6c8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff6c0,
                   (char *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                   in_stack_fffffffffffff6b0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff6c0,
                   (char *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                   in_stack_fffffffffffff6b0);
        exception_message(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e4,
                          in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
        parse_error::create<std::nullptr_t,_0>
                  (in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a0,
                   (string *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
                   in_stack_fffffffffffff790);
        local_1 = (**(code **)(*plVar8 + 0x60))(plVar8,uVar9,local_4a8,local_4d0);
        local_1 = local_1 & 1;
        parse_error::~parse_error((parse_error *)0x27b881);
        std::__cxx11::string::~string(local_4f0);
        std::__cxx11::string::~string(local_538);
        std::allocator<char>::~allocator(&local_539);
        std::__cxx11::string::~string(local_510);
        std::allocator<char>::~allocator(&local_511);
        std::__cxx11::string::~string(local_4a8);
      }
      goto LAB_0027c37b;
    }
    break;
  case 0x69:
    local_26 = '\0';
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<signed_char,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffff6af,
                                   CONCAT16(in_stack_fffffffffffff6ae,
                                            CONCAT15(in_stack_fffffffffffff6ad,
                                                     in_stack_fffffffffffff6a8))),iVar12,
                       (char *)CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_26 < '\0') {
        uVar9 = *(undefined8 *)(in_RDI + 0x18);
        plVar8 = *(long **)(in_RDI + 0x28);
        get_token_string(in_stack_fffffffffffff6c8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff6c0,
                   (char *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                   in_stack_fffffffffffff6b0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff6c0,
                   (char *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                   in_stack_fffffffffffff6b0);
        exception_message(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e4,
                          in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
        parse_error::create<std::nullptr_t,_0>
                  (in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a0,
                   (string *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
                   in_stack_fffffffffffff790);
        local_1 = (**(code **)(*plVar8 + 0x60))(plVar8,uVar9,local_48,local_70);
        local_1 = local_1 & 1;
        parse_error::~parse_error((parse_error *)0x27a6c5);
        std::__cxx11::string::~string(local_90);
        std::__cxx11::string::~string(local_e8);
        std::allocator<char>::~allocator(&local_e9);
        std::__cxx11::string::~string(local_b0);
        std::allocator<char>::~allocator(&local_b1);
        std::__cxx11::string::~string(local_48);
      }
      else {
        *local_18 = (long)local_26;
        local_1 = 1;
      }
    }
    else {
      local_1 = 0;
    }
    goto LAB_0027c37b;
  case 0x6c:
    local_1a8 = 0;
    bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
            ::get_number<int,false>
                      ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT17(in_stack_fffffffffffff6af,
                                   CONCAT16(in_stack_fffffffffffff6ae,
                                            CONCAT15(in_stack_fffffffffffff6ad,
                                                     in_stack_fffffffffffff6a8))),iVar12,
                       (int *)CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_1a8 < 0) {
        uVar9 = *(undefined8 *)(in_RDI + 0x18);
        plVar8 = *(long **)(in_RDI + 0x28);
        get_token_string(in_stack_fffffffffffff6c8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff6c0,
                   (char *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                   in_stack_fffffffffffff6b0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff6c0,
                   (char *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
                   in_stack_fffffffffffff6b0);
        exception_message(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e4,
                          in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
        parse_error::create<std::nullptr_t,_0>
                  (in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a0,
                   (string *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
                   in_stack_fffffffffffff790);
        local_1 = (**(code **)(*plVar8 + 0x60))(plVar8,uVar9,local_1c8,local_1f0);
        local_1 = local_1 & 1;
        parse_error::~parse_error((parse_error *)0x27ac8f);
        std::__cxx11::string::~string(local_210);
        std::__cxx11::string::~string(local_258);
        std::allocator<char>::~allocator(&local_259);
        std::__cxx11::string::~string(local_230);
        std::allocator<char>::~allocator(&local_231);
        std::__cxx11::string::~string(local_1c8);
      }
      else {
        *local_18 = (long)local_1a8;
        local_1 = 1;
      }
    }
    else {
      local_1 = 0;
    }
    goto LAB_0027c37b;
  case 0x6d:
    if (*(int *)(in_RDI + 0x24) == 5) {
      local_3d0 = 0;
      bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
              ::get_number<unsigned_int,false>
                        ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                          *)CONCAT17(in_stack_fffffffffffff6af,
                                     CONCAT16(in_stack_fffffffffffff6ae,
                                              CONCAT15(in_stack_fffffffffffff6ad,
                                                       in_stack_fffffffffffff6a8))),iVar12,
                         (uint *)CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        uVar4 = conditional_static_cast<unsigned_long,_unsigned_int,_0>(local_3d0);
        *local_18 = uVar4;
        local_1 = 1;
      }
      else {
        local_1 = 0;
      }
      goto LAB_0027c37b;
    }
    break;
  case 0x75:
    if (*(int *)(in_RDI + 0x24) == 5) {
      local_3cc = 0;
      bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
              ::get_number<unsigned_short,false>
                        ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                          *)CONCAT17(in_stack_fffffffffffff6af,
                                     CONCAT16(in_stack_fffffffffffff6ae,
                                              CONCAT15(in_stack_fffffffffffff6ad,
                                                       in_stack_fffffffffffff6a8))),iVar12,
                         (unsigned_short *)
                         CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        *local_18 = (ulong)(ushort)local_3cc;
        local_1 = 1;
      }
      else {
        local_1 = 0;
      }
      goto LAB_0027c37b;
    }
  }
  get_token_string(in_stack_fffffffffffff6c8);
  std::__cxx11::string::string(local_6b8);
  if (*(int *)(in_RDI + 0x24) == 5) {
    std::operator+((char *)in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0);
    std::__cxx11::string::operator=(local_6b8,local_6f8);
    std::__cxx11::string::~string(local_6f8);
  }
  else {
    std::operator+((char *)in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0);
    std::__cxx11::string::operator=(local_6b8,local_6d8);
    std::__cxx11::string::~string(local_6d8);
  }
  plVar8 = *(long **)(in_RDI + 0x28);
  uVar9 = *(undefined8 *)(in_RDI + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6c0,
             (char *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8),
             in_stack_fffffffffffff6b0);
  exception_message(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e4,in_stack_fffffffffffff6d8,
                    in_stack_fffffffffffff6d0);
  parse_error::create<std::nullptr_t,_0>
            (in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a0,
             (string *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
             in_stack_fffffffffffff790);
  local_1 = (**(code **)(*plVar8 + 0x60))(plVar8,uVar9,local_698,local_720);
  local_1 = local_1 & 1;
  parse_error::~parse_error((parse_error *)0x27c284);
  std::__cxx11::string::~string(local_740);
  std::__cxx11::string::~string(local_760);
  std::allocator<char>::~allocator(&local_761);
  local_55c = 1;
  std::__cxx11::string::~string(local_6b8);
  std::__cxx11::string::~string(local_698);
LAB_0027c37b:
  return (bool)(local_1 & 1);
}

Assistant:

bool get_ubjson_size_value(std::size_t& result, bool& is_ndarray, char_int_type prefix = 0)
    {
        if (prefix == 0)
        {
            prefix = get_ignore_noop();
        }

        switch (prefix)
        {
            case 'U':
            {
                std::uint8_t number{};
                if (JSON_HEDLEY_UNLIKELY(!get_number(input_format, number)))
                {
                    return false;
                }
                result = static_cast<std::size_t>(number);
                return true;
            }

            case 'i':
            {
                std::int8_t number{};
                if (JSON_HEDLEY_UNLIKELY(!get_number(input_format, number)))
                {
                    return false;
                }
                if (number < 0)
                {
                    return sax->parse_error(chars_read, get_token_string(), parse_error::create(113, chars_read,
                                            exception_message(input_format, "count in an optimized container must be positive", "size"), nullptr));
                }
                result = static_cast<std::size_t>(number); // NOLINT(bugprone-signed-char-misuse,cert-str34-c): number is not a char
                return true;
            }

            case 'I':
            {
                std::int16_t number{};
                if (JSON_HEDLEY_UNLIKELY(!get_number(input_format, number)))
                {
                    return false;
                }
                if (number < 0)
                {
                    return sax->parse_error(chars_read, get_token_string(), parse_error::create(113, chars_read,
                                            exception_message(input_format, "count in an optimized container must be positive", "size"), nullptr));
                }
                result = static_cast<std::size_t>(number);
                return true;
            }

            case 'l':
            {
                std::int32_t number{};
                if (JSON_HEDLEY_UNLIKELY(!get_number(input_format, number)))
                {
                    return false;
                }
                if (number < 0)
                {
                    return sax->parse_error(chars_read, get_token_string(), parse_error::create(113, chars_read,
                                            exception_message(input_format, "count in an optimized container must be positive", "size"), nullptr));
                }
                result = static_cast<std::size_t>(number);
                return true;
            }

            case 'L':
            {
                std::int64_t number{};
                if (JSON_HEDLEY_UNLIKELY(!get_number(input_format, number)))
                {
                    return false;
                }
                if (number < 0)
                {
                    return sax->parse_error(chars_read, get_token_string(), parse_error::create(113, chars_read,
                                            exception_message(input_format, "count in an optimized container must be positive", "size"), nullptr));
                }
                if (!value_in_range_of<std::size_t>(number))
                {
                    return sax->parse_error(chars_read, get_token_string(), out_of_range::create(408,
                                            exception_message(input_format, "integer value overflow", "size"), nullptr));
                }
                result = static_cast<std::size_t>(number);
                return true;
            }

            case 'u':
            {
                if (input_format != input_format_t::bjdata)
                {
                    break;
                }
                std::uint16_t number{};
                if (JSON_HEDLEY_UNLIKELY(!get_number(input_format, number)))
                {
                    return false;
                }
                result = static_cast<std::size_t>(number);
                return true;
            }

            case 'm':
            {
                if (input_format != input_format_t::bjdata)
                {
                    break;
                }
                std::uint32_t number{};
                if (JSON_HEDLEY_UNLIKELY(!get_number(input_format, number)))
                {
                    return false;
                }
                result = conditional_static_cast<std::size_t>(number);
                return true;
            }

            case 'M':
            {
                if (input_format != input_format_t::bjdata)
                {
                    break;
                }
                std::uint64_t number{};
                if (JSON_HEDLEY_UNLIKELY(!get_number(input_format, number)))
                {
                    return false;
                }
                if (!value_in_range_of<std::size_t>(number))
                {
                    return sax->parse_error(chars_read, get_token_string(), out_of_range::create(408,
                                            exception_message(input_format, "integer value overflow", "size"), nullptr));
                }
                result = detail::conditional_static_cast<std::size_t>(number);
                return true;
            }

            case '[':
            {
                if (input_format != input_format_t::bjdata)
                {
                    break;
                }
                if (is_ndarray) // ndarray dimensional vector can only contain integers, and can not embed another array
                {
                    return sax->parse_error(chars_read, get_token_string(), parse_error::create(113, chars_read, exception_message(input_format, "ndarray dimensional vector is not allowed", "size"), nullptr));
                }
                std::vector<size_t> dim;
                if (JSON_HEDLEY_UNLIKELY(!get_ubjson_ndarray_size(dim)))
                {
                    return false;
                }
                if (dim.size() == 1 || (dim.size() == 2 && dim.at(0) == 1)) // return normal array size if 1D row vector
                {
                    result = dim.at(dim.size() - 1);
                    return true;
                }
                if (!dim.empty())  // if ndarray, convert to an object in JData annotated array format
                {
                    for (auto i : dim) // test if any dimension in an ndarray is 0, if so, return a 1D empty container
                    {
                        if ( i == 0 )
                        {
                            result = 0;
                            return true;
                        }
                    }

                    string_t key = "_ArraySize_";
                    if (JSON_HEDLEY_UNLIKELY(!sax->start_object(3) || !sax->key(key) || !sax->start_array(dim.size())))
                    {
                        return false;
                    }
                    result = 1;
                    for (auto i : dim)
                    {
                        result *= i;
                        if (result == 0 || result == npos) // because dim elements shall not have zeros, result = 0 means overflow happened; it also can't be npos as it is used to initialize size in get_ubjson_size_type()
                        {
                            return sax->parse_error(chars_read, get_token_string(), out_of_range::create(408, exception_message(input_format, "excessive ndarray size caused overflow", "size"), nullptr));
                        }
                        if (JSON_HEDLEY_UNLIKELY(!sax->number_unsigned(static_cast<number_unsigned_t>(i))))
                        {
                            return false;
                        }
                    }
                    is_ndarray = true;
                    return sax->end_array();
                }
                result = 0;
                return true;
            }

            default:
                break;
        }
        auto last_token = get_token_string();
        std::string message;

        if (input_format != input_format_t::bjdata)
        {
            message = "expected length type specification (U, i, I, l, L) after '#'; last byte: 0x" + last_token;
        }
        else
        {
            message = "expected length type specification (U, i, u, I, m, l, M, L) after '#'; last byte: 0x" + last_token;
        }
        return sax->parse_error(chars_read, last_token, parse_error::create(113, chars_read, exception_message(input_format, message, "size"), nullptr));
    }